

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O2

int cram_load_reference(cram_fd *fd,char *fn)

{
  int iVar1;
  refs_t *prVar2;
  uint is_err;
  SAM_hdr *h;
  int iVar3;
  char *pcVar4;
  
  prVar2 = fd->refs;
  iVar3 = -1;
  if (fn == (char *)0x0) {
    fd->ref_fn = (char *)0x0;
    if (prVar2 == (refs_t *)0x0) goto LAB_00126dae;
    pcVar4 = (char *)0x0;
LAB_00126d82:
    if (pcVar4 != (char *)0x0 || prVar2->nref != 0) goto LAB_00126dda;
    if (fd->header != (SAM_hdr *)0x0) {
      refs_free(prVar2);
LAB_00126db9:
      prVar2 = refs_create();
      fd->refs = prVar2;
      if (prVar2 == (refs_t *)0x0) {
        return -1;
      }
      iVar1 = refs_from_header(prVar2,(cram_fd *)fd->header,h);
      if (iVar1 == -1) {
        return -1;
      }
    }
  }
  else {
    if (fd->embed_ref == 0) {
      is_err = 1;
    }
    else {
      is_err = (uint)(fd->mode != 0x72);
    }
    prVar2 = refs_load_fai(prVar2,fn,is_err);
    fd->refs = prVar2;
    if (prVar2 != (refs_t *)0x0) {
      pcVar4 = prVar2->fn;
      fd->ref_fn = pcVar4;
      goto LAB_00126d82;
    }
    fd->ref_fn = (char *)0x0;
LAB_00126dae:
    if (fd->header != (SAM_hdr *)0x0) goto LAB_00126db9;
  }
  pcVar4 = (char *)0x0;
LAB_00126dda:
  if ((fd->header == (SAM_hdr *)0x0) || (iVar1 = refs2id(fd->refs,fd->header), iVar1 != -1)) {
    iVar3 = -(uint)(pcVar4 == (char *)0x0);
  }
  return iVar3;
}

Assistant:

int cram_load_reference(cram_fd *fd, char *fn) {
    if (fn) {
	fd->refs = refs_load_fai(fd->refs, fn,
				 !(fd->embed_ref && fd->mode == 'r'));
	fn = fd->refs ? fd->refs->fn : NULL;
    }
    fd->ref_fn = fn;

    if ((!fd->refs || (fd->refs->nref == 0 && !fn)) && fd->header) {
	if (fd->refs)
	    refs_free(fd->refs);
	if (!(fd->refs = refs_create()))
	    return -1;
	if (-1 == refs_from_header(fd->refs, fd, fd->header))
	    return -1;
    }

    if (fd->header)
	if (-1 == refs2id(fd->refs, fd->header))
	    return -1;

    return fn ? 0 : -1;
}